

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_libc.cc
# Opt level: O0

civil_lookup * __thiscall
absl::lts_20250127::time_internal::cctz::TimeZoneLibC::MakeTime
          (civil_lookup *__return_storage_ptr__,TimeZoneLibC *this,civil_second *cs)

{
  fields fVar1;
  fields fVar2;
  fields *lhs;
  bool bVar3;
  int iVar4;
  int_fast64_t iVar5;
  diff_t t;
  year_t yVar6;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  tVar7;
  time_point<seconds> tVar8;
  time_t t_00;
  time_point<seconds> tVar9;
  time_point<seconds> tVar10;
  diff_t in_RCX;
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> a;
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> a_00;
  char *local_1a0;
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> local_168;
  duration local_158;
  time_point<seconds> tp;
  time_point<seconds> post;
  time_point<seconds> pre;
  time_point<seconds> post_1;
  time_point<seconds> pre_1;
  time_point<seconds> trans;
  time_t tt;
  tm_gmtoff_t offset;
  time_point<seconds> tp_4;
  tm tm1;
  tm tm0;
  time_t t1;
  time_t t0;
  time_point<seconds> tp_3;
  time_point<seconds> tp_2;
  duration local_60;
  time_point<seconds> tp_1;
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> local_50 [2];
  time_point<seconds> local_30;
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> local_28;
  fields *local_18;
  civil_second *cs_local;
  TimeZoneLibC *this_local;
  
  local_18 = &cs->f_;
  cs_local = (civil_second *)this;
  if ((this->local_ & 1U) == 0) {
    fVar1 = MakeTime::min_tp_cs.f_;
    if (MakeTime(absl::lts_20250127::time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>const&)
        ::min_tp_cs == '\0') {
      iVar4 = __cxa_guard_acquire(&MakeTime(absl::lts_20250127::time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>const&)
                                   ::min_tp_cs);
      fVar1.m = MakeTime::min_tp_cs.f_.m;
      fVar1.d = MakeTime::min_tp_cs.f_.d;
      fVar1.hh = MakeTime::min_tp_cs.f_.hh;
      fVar1.mm = MakeTime::min_tp_cs.f_.mm;
      fVar1.ss = MakeTime::min_tp_cs.f_.ss;
      fVar1._13_3_ = MakeTime::min_tp_cs.f_._13_3_;
      fVar1.y = MakeTime::min_tp_cs.f_.y;
      if (iVar4 != 0) {
        detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::civil_time
                  (&local_28);
        local_30.__d.__r =
             (duration)
             std::chrono::
             time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
             ::min();
        iVar5 = ToUnixSeconds(&local_30);
        a.f_.m = (char)iVar5;
        a.f_.d = (char)((ulong)iVar5 >> 8);
        a.f_.hh = (char)((ulong)iVar5 >> 0x10);
        a.f_.mm = (char)((ulong)iVar5 >> 0x18);
        a.f_.ss = (char)((ulong)iVar5 >> 0x20);
        a.f_._13_3_ = (int3)((ulong)iVar5 >> 0x28);
        a.f_.y._0_1_ = local_28.f_.m;
        a.f_.y._1_1_ = local_28.f_.d;
        a.f_.y._2_1_ = local_28.f_.hh;
        a.f_.y._3_1_ = local_28.f_.mm;
        a.f_.y._4_1_ = local_28.f_.ss;
        a.f_.y._5_3_ = local_28.f_._13_3_;
        MakeTime::min_tp_cs.f_ = (fields)detail::operator+((detail *)local_28.f_.y,a,in_RCX);
        __cxa_guard_release(&MakeTime(absl::lts_20250127::time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>const&)
                             ::min_tp_cs);
        fVar1 = MakeTime::min_tp_cs.f_;
      }
    }
    fVar2.m = MakeTime::max_tp_cs.f_.m;
    fVar2.d = MakeTime::max_tp_cs.f_.d;
    fVar2.hh = MakeTime::max_tp_cs.f_.hh;
    fVar2.mm = MakeTime::max_tp_cs.f_.mm;
    fVar2.ss = MakeTime::max_tp_cs.f_.ss;
    fVar2._13_3_ = MakeTime::max_tp_cs.f_._13_3_;
    fVar2.y = MakeTime::max_tp_cs.f_.y;
    MakeTime::min_tp_cs.f_ = fVar1;
    if (MakeTime(absl::lts_20250127::time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>const&)
        ::max_tp_cs == '\0') {
      iVar4 = __cxa_guard_acquire(&MakeTime(absl::lts_20250127::time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>const&)
                                   ::max_tp_cs);
      fVar2.m = MakeTime::max_tp_cs.f_.m;
      fVar2.d = MakeTime::max_tp_cs.f_.d;
      fVar2.hh = MakeTime::max_tp_cs.f_.hh;
      fVar2.mm = MakeTime::max_tp_cs.f_.mm;
      fVar2.ss = MakeTime::max_tp_cs.f_.ss;
      fVar2._13_3_ = MakeTime::max_tp_cs.f_._13_3_;
      fVar2.y = MakeTime::max_tp_cs.f_.y;
      if (iVar4 != 0) {
        detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::civil_time
                  (local_50);
        tp_1.__d.__r = (duration)
                       std::chrono::
                       time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                       ::max();
        iVar5 = ToUnixSeconds(&tp_1);
        a_00.f_.m = (char)iVar5;
        a_00.f_.d = (char)((ulong)iVar5 >> 8);
        a_00.f_.hh = (char)((ulong)iVar5 >> 0x10);
        a_00.f_.mm = (char)((ulong)iVar5 >> 0x18);
        a_00.f_.ss = (char)((ulong)iVar5 >> 0x20);
        a_00.f_._13_3_ = (int3)((ulong)iVar5 >> 0x28);
        a_00.f_.y._0_1_ = local_50[0].f_.m;
        a_00.f_.y._1_1_ = local_50[0].f_.d;
        a_00.f_.y._2_1_ = local_50[0].f_.hh;
        a_00.f_.y._3_1_ = local_50[0].f_.mm;
        a_00.f_.y._4_1_ = local_50[0].f_.ss;
        a_00.f_.y._5_3_ = local_50[0].f_._13_3_;
        MakeTime::max_tp_cs.f_ = (fields)detail::operator+((detail *)local_50[0].f_.y,a_00,in_RCX);
        __cxa_guard_release(&MakeTime(absl::lts_20250127::time_internal::cctz::detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>const&)
                             ::max_tp_cs);
        fVar2 = MakeTime::max_tp_cs.f_;
      }
    }
    MakeTime::max_tp_cs.f_ = fVar2;
    bVar3 = detail::operator<((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                               *)local_18,&MakeTime::min_tp_cs);
    if (bVar3) {
      local_60.__r = (rep)std::chrono::
                          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                          ::min();
    }
    else {
      bVar3 = detail::operator>((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                                 *)local_18,&MakeTime::max_tp_cs);
      if (bVar3) {
        local_60.__r = (rep)std::chrono::
                            time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                            ::max();
      }
      else {
        fVar1 = *local_18;
        detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::civil_time
                  ((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *)&tp_2)
        ;
        t = detail::operator-((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                               )fVar1,(civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                                       )_tp_2);
        local_60.__r = (rep)FromUnixSeconds(t);
      }
    }
    __return_storage_ptr__->kind = UNIQUE;
    (__return_storage_ptr__->pre).__d.__r = local_60.__r;
    (__return_storage_ptr__->trans).__d.__r = local_60.__r;
    (__return_storage_ptr__->post).__d.__r = local_60.__r;
  }
  else {
    yVar6 = detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::year
                      (cs);
    if (yVar6 < 0) {
      yVar6 = detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::year
                        ((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *)
                         local_18);
      iVar4 = std::numeric_limits<int>::min();
      if (yVar6 < (long)iVar4 + 0x76c) {
        tVar7 = std::chrono::
                time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                ::min();
        __return_storage_ptr__->kind = UNIQUE;
        (__return_storage_ptr__->pre).__d.__r = (rep)tVar7.__d.__r;
        (__return_storage_ptr__->trans).__d.__r = (rep)tVar7.__d.__r;
        (__return_storage_ptr__->post).__d.__r = (rep)tVar7.__d.__r;
        goto LAB_006dd968;
      }
    }
    else {
      yVar6 = detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::year
                        ((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *)
                         local_18);
      iVar4 = std::numeric_limits<int>::max();
      if ((long)iVar4 < yVar6 + -0x76c) {
        tVar7 = std::chrono::
                time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                ::max();
        __return_storage_ptr__->kind = UNIQUE;
        (__return_storage_ptr__->pre).__d.__r = (rep)tVar7.__d.__r;
        (__return_storage_ptr__->trans).__d.__r = (rep)tVar7.__d.__r;
        (__return_storage_ptr__->post).__d.__r = (rep)tVar7.__d.__r;
        goto LAB_006dd968;
      }
    }
    bVar3 = anon_unknown_10::make_time((civil_second *)local_18,0,&t1,(tm *)&tm1.tm_zone);
    if ((bVar3) &&
       (bVar3 = anon_unknown_10::make_time
                          ((civil_second *)local_18,1,(time_t *)&tm0.tm_zone,(tm *)&tp_4), bVar3)) {
      if (tm0.tm_wday == tm1.tm_wday) {
        if (tm0.tm_wday == 0) {
          local_1a0 = (char *)t1;
        }
        else {
          local_1a0 = tm0.tm_zone;
        }
        tVar8 = FromUnixSeconds((int_fast64_t)local_1a0);
        __return_storage_ptr__->kind = UNIQUE;
        (__return_storage_ptr__->pre).__d.__r = (rep)tVar8.__d.__r;
        (__return_storage_ptr__->trans).__d.__r = (rep)tVar8.__d.__r;
        (__return_storage_ptr__->post).__d.__r = (rep)tVar8.__d.__r;
      }
      else {
        tt = anon_unknown_10::tm_gmtoff<tm>((tm *)&tm1.tm_zone);
        if (t1 < (long)tm0.tm_zone) {
          std::swap<long>(&t1,(long *)&tm0.tm_zone);
          tt = anon_unknown_10::tm_gmtoff<tm>((tm *)&tp_4);
        }
        t_00 = anon_unknown_10::find_trans((time_t)tm0.tm_zone,t1,tt);
        tVar8 = FromUnixSeconds(t_00);
        if (tm0.tm_wday == 0) {
          tVar9 = FromUnixSeconds((int_fast64_t)tm0.tm_zone);
          tVar10 = FromUnixSeconds(t1);
          __return_storage_ptr__->kind = REPEATED;
          (__return_storage_ptr__->pre).__d.__r = (rep)tVar9.__d.__r;
          (__return_storage_ptr__->trans).__d.__r = (rep)tVar8.__d.__r;
          (__return_storage_ptr__->post).__d.__r = (rep)tVar10.__d.__r;
        }
        else {
          tVar9 = FromUnixSeconds(t1);
          tVar10 = FromUnixSeconds((int_fast64_t)tm0.tm_zone);
          __return_storage_ptr__->kind = SKIPPED;
          (__return_storage_ptr__->pre).__d.__r = (rep)tVar9.__d.__r;
          (__return_storage_ptr__->trans).__d.__r = (rep)tVar8.__d.__r;
          (__return_storage_ptr__->post).__d.__r = (rep)tVar10.__d.__r;
        }
      }
    }
    else {
      lhs = local_18;
      detail::civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::civil_time
                (&local_168);
      bVar3 = detail::operator<((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                                 *)lhs,&local_168);
      if (bVar3) {
        local_158.__r =
             (rep)std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                  ::min();
      }
      else {
        local_158.__r =
             (rep)std::chrono::
                  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                  ::max();
      }
      __return_storage_ptr__->kind = UNIQUE;
      (__return_storage_ptr__->pre).__d.__r = local_158.__r;
      (__return_storage_ptr__->trans).__d.__r = local_158.__r;
      (__return_storage_ptr__->post).__d.__r = local_158.__r;
    }
  }
LAB_006dd968:
  return __return_storage_ptr__;
}

Assistant:

time_zone::civil_lookup TimeZoneLibC::MakeTime(const civil_second& cs) const {
  if (!local_) {
    // If time_point<seconds> cannot hold the result we saturate.
    static const civil_second min_tp_cs =
        civil_second() + ToUnixSeconds(time_point<seconds>::min());
    static const civil_second max_tp_cs =
        civil_second() + ToUnixSeconds(time_point<seconds>::max());
    const time_point<seconds> tp = (cs < min_tp_cs) ? time_point<seconds>::min()
                                   : (cs > max_tp_cs)
                                       ? time_point<seconds>::max()
                                       : FromUnixSeconds(cs - civil_second());
    return {time_zone::civil_lookup::UNIQUE, tp, tp, tp};
  }

  // If tm_year cannot hold the requested year we saturate the result.
  if (cs.year() < 0) {
    if (cs.year() < std::numeric_limits<int>::min() + year_t{1900}) {
      const time_point<seconds> tp = time_point<seconds>::min();
      return {time_zone::civil_lookup::UNIQUE, tp, tp, tp};
    }
  } else {
    if (cs.year() - year_t{1900} > std::numeric_limits<int>::max()) {
      const time_point<seconds> tp = time_point<seconds>::max();
      return {time_zone::civil_lookup::UNIQUE, tp, tp, tp};
    }
  }

  // We probe with "is_dst" values of 0 and 1 to try to distinguish unique
  // civil seconds from skipped or repeated ones.  This is not always possible
  // however, as the "dst" flag does not change over some offset transitions.
  // We are also subject to the vagaries of mktime() implementations. For
  // example, some implementations treat "tm_isdst" as a demand (useless),
  // and some as a disambiguator (useful).
  std::time_t t0, t1;
  std::tm tm0, tm1;
  if (make_time(cs, 0, &t0, &tm0) && make_time(cs, 1, &t1, &tm1)) {
    if (tm0.tm_isdst == tm1.tm_isdst) {
      // The civil time was singular (pre == trans == post).
      const time_point<seconds> tp = FromUnixSeconds(tm0.tm_isdst ? t1 : t0);
      return {time_zone::civil_lookup::UNIQUE, tp, tp, tp};
    }

    tm_gmtoff_t offset = tm_gmtoff(tm0);
    if (t0 < t1) {  // negative DST
      std::swap(t0, t1);
      offset = tm_gmtoff(tm1);
    }

    const std::time_t tt = find_trans(t1, t0, offset);
    const time_point<seconds> trans = FromUnixSeconds(tt);

    if (tm0.tm_isdst) {
      // The civil time did not exist (pre >= trans > post).
      const time_point<seconds> pre = FromUnixSeconds(t0);
      const time_point<seconds> post = FromUnixSeconds(t1);
      return {time_zone::civil_lookup::SKIPPED, pre, trans, post};
    }

    // The civil time was ambiguous (pre < trans <= post).
    const time_point<seconds> pre = FromUnixSeconds(t1);
    const time_point<seconds> post = FromUnixSeconds(t0);
    return {time_zone::civil_lookup::REPEATED, pre, trans, post};
  }

  // make_time() failed somehow so we saturate the result.
  const time_point<seconds> tp = (cs < civil_second())
                                     ? time_point<seconds>::min()
                                     : time_point<seconds>::max();
  return {time_zone::civil_lookup::UNIQUE, tp, tp, tp};
}